

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O1

void __thiscall
TPZPrInteg<TPZPrInteg<TPZPrInteg<TPZInt1Point>_>_>::TPZPrInteg
          (TPZPrInteg<TPZPrInteg<TPZPrInteg<TPZInt1Point>_>_> *this,int order)

{
  TPZGaussRule *pTVar1;
  
  TPZPrInteg<TPZPrInteg<TPZInt1Point>_>::TPZPrInteg
            (&this->super_TPZPrInteg<TPZPrInteg<TPZInt1Point>_>,order);
  (this->super_TPZPrInteg<TPZPrInteg<TPZInt1Point>_>).super_TPZPrInteg<TPZInt1Point>.
  super_TPZInt1Point.super_TPZIntPoints._vptr_TPZIntPoints = (_func_int **)&PTR__TPZPrInteg_018446a0
  ;
  if (order < 1) {
    this->fOrdKsi = 0;
    this->fIntP = (TPZGaussRule *)0x0;
  }
  else {
    pTVar1 = TPZIntRuleList::GetRule(&TPZIntRuleList::gIntRuleList,order,0);
    this->fIntP = pTVar1;
    this->fOrdKsi = order;
  }
  return;
}

Assistant:

TPZPrInteg(int order) : TFather(order)
    {
		if(order>0)
		{
			fIntP   = TPZIntRuleList::gIntRuleList.GetRule(order);
			fOrdKsi = order;
		}
		else
		{
			fOrdKsi = 0;
			fIntP = 0;
		}
    }